

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_swap_asi(DisasContext_conflict8 *dc,TCGv_i32 dst,TCGv_i32 src,TCGv_i32 addr,int insn)

{
  DisasASI DVar1;
  ASIType local_3c;
  DisasASI da;
  int insn_local;
  TCGv_i32 addr_local;
  TCGv_i32 src_local;
  TCGv_i32 dst_local;
  DisasContext_conflict8 *dc_local;
  
  DVar1 = get_asi(dc,insn,MO_BEUL);
  local_3c = DVar1.type;
  if (local_3c != GET_ASI_EXCP) {
    if (local_3c == GET_ASI_DIRECT) {
      da.type = DVar1.mem_idx;
      da.asi = DVar1.memop;
      gen_swap(dc,dst,src,addr,da.type,da.asi);
    }
    else {
      gen_exception(dc,0x32);
    }
  }
  return;
}

Assistant:

static void gen_swap_asi(DisasContext *dc, TCGv dst, TCGv src,
                         TCGv addr, int insn)
{
    DisasASI da = get_asi(dc, insn, MO_TEUL);

    switch (da.type) {
    case GET_ASI_EXCP:
        break;
    case GET_ASI_DIRECT:
        gen_swap(dc, dst, src, addr, da.mem_idx, da.memop);
        break;
    default:
        /* ??? Should be DAE_invalid_asi.  */
        gen_exception(dc, TT_DATA_ACCESS);
        break;
    }
}